

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeStructNew
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType type)

{
  Struct *this_00;
  size_type size;
  StructNew *expr;
  bool bVar1;
  Ok local_d1;
  IRBuilder *local_d0;
  uint local_c4;
  Err local_c0;
  Err *local_90;
  Err *err;
  Result<wasm::Ok> _val;
  Type local_58;
  undefined1 local_50 [8];
  StructNew curr;
  IRBuilder *this_local;
  HeapType type_local;
  
  curr.operands.allocator = (MixedArena *)this;
  this_local = (IRBuilder *)type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  StructNew::StructNew((StructNew *)local_50,&this->wasm->allocator);
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = this_local;
  wasm::Type::Type(&local_58,(HeapType)this_local,NonNullable,Inexact);
  curr.super_SpecificExpression<(wasm::Expression::Id)65>.super_Expression._0_8_ = local_58.id;
  this_00 = HeapType::getStruct((HeapType *)&this_local);
  size = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this_00->fields);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &curr.super_SpecificExpression<(wasm::Expression::Id)65>.super_Expression.type,size);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitStructNew
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (StructNew *)local_50);
  local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar1 = local_90 != (Err *)0x0;
  if (bVar1) {
    wasm::Err::Err(&local_c0,local_90);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
    wasm::Err::~Err(&local_c0);
  }
  local_c4 = (uint)bVar1;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_c4 == 0) {
    local_d0 = this_local;
    expr = Builder::makeStructNew
                     (&this->builder,(HeapType)this_local,
                      (ExpressionList *)
                      &curr.super_SpecificExpression<(wasm::Expression::Id)65>.super_Expression.type
                     );
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeStructNew(HeapType type) {
  StructNew curr(wasm.allocator);
  curr.type = Type(type, NonNullable);
  // Differentiate from struct.new_default with a non-empty expression list.
  curr.operands.resize(type.getStruct().fields.size());
  CHECK_ERR(visitStructNew(&curr));
  push(builder.makeStructNew(type, std::move(curr.operands)));
  return Ok{};
}